

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_sequence_list(t_text_sequence *x,t_symbol *s,int argc,t_atom *argv)

{
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_text_sequence *x_local;
  
  x->x_loop = '\x01';
  while (x->x_loop != '\0') {
    if (argc == 0) {
      text_sequence_doit(x,x->x_argc,x->x_argv);
    }
    else {
      text_sequence_doit(x,argc,argv);
    }
  }
  return;
}

Assistant:

static void text_sequence_list(t_text_sequence *x, t_symbol *s, int argc,
    t_atom *argv)
{
    x->x_loop = 1;
    while (x->x_loop)
    {
        if (argc)
            text_sequence_doit(x, argc, argv);
        else text_sequence_doit(x, x->x_argc, x->x_argv);
    }
}